

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O1

int __thiscall
absl::synchronization_internal::MutexDelay(synchronization_internal *this,int32_t c,int mode)

{
  Duration duration;
  uint in_EAX;
  undefined4 in_register_00000014;
  int iVar1;
  undefined8 unaff_RBX;
  ScopedEnable enable_rescheduling;
  int iVar2;
  
  if (absl::(anonymous_namespace)::GetMutexGlobals()::data != 0xdd) {
    base_internal::CallOnceImpl<absl::(anonymous_namespace)::GetMutexGlobals()::__0>
              ((atomic<unsigned_int> *)&absl::(anonymous_namespace)::GetMutexGlobals()::data,c,
               (anon_class_1_0_00000001 *)CONCAT44(in_register_00000014,mode));
  }
  iVar1 = (int)this;
  if (iVar1 < *(int *)(&DAT_0018b7c8 + (long)c * 4)) {
    iVar1 = iVar1 + 1;
  }
  else {
    iVar2 = 0;
    if (*(int *)(&DAT_0018b7c8 + (long)c * 4) == iVar1) {
      AbslInternalMutexYield();
      iVar1 = iVar1 + 1;
    }
    else {
      iVar1 = 0;
      duration._8_8_ = unaff_RBX;
      duration.rep_hi_ = (ulong)in_EAX;
      AbslInternalSleepFor(duration);
    }
    if (iVar2 != 0) {
      raw_logging_internal::RawLog
                (kFatal,"low_level_scheduling.h",0x7f,"Check %s failed: %s",
                 "scheduling_disabled_depth_ == 0","disable unused warning");
    }
  }
  return iVar1;
}

Assistant:

int MutexDelay(int32_t c, int mode) {
  const int32_t limit = GetMutexGlobals().mutex_sleep_limit[mode];
  if (c < limit) {
    // Spin.
    c++;
  } else {
    SchedulingGuard::ScopedEnable enable_rescheduling;
    ABSL_TSAN_MUTEX_PRE_DIVERT(nullptr, 0);
    if (c == limit) {
      // Yield once.
      ABSL_INTERNAL_C_SYMBOL(AbslInternalMutexYield)();
      c++;
    } else {
      // Then wait.
      absl::SleepFor(absl::Microseconds(10));
      c = 0;
    }
    ABSL_TSAN_MUTEX_POST_DIVERT(nullptr, 0);
  }
  return c;
}